

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_array.h
# Opt level: O2

size_t __thiscall v_array<node_pred>::unique_add_sorted(v_array<node_pred> *this,node_pred *new_ele)

{
  node_pred *pnVar1;
  node_pred *pnVar2;
  uint32_t uVar3;
  float fVar4;
  bool bVar5;
  size_t sVar6;
  long lVar7;
  size_t index;
  
  index = 0;
  sVar6 = ((long)this->_end - (long)this->_begin) / 0x18;
  bVar5 = contain_sorted(this,new_ele,&index);
  if (!bVar5) {
    if (this->_end == this->end_array) {
      resize(this,(((long)this->_end - (long)this->_begin) / 0x18) * 2 + 3);
    }
    lVar7 = sVar6 - index;
    if (lVar7 != 0) {
      memmove(this->_begin + index + 1,this->_begin + index,lVar7 * 0x18);
      sVar6 = index;
    }
    pnVar1 = this->_begin;
    uVar3 = new_ele->label_count;
    pnVar2 = pnVar1 + sVar6;
    pnVar2->label = new_ele->label;
    pnVar2->label_count = uVar3;
    fVar4 = new_ele->norm_Ehk;
    uVar3 = new_ele->nk;
    pnVar1 = pnVar1 + sVar6;
    pnVar1->Ehk = new_ele->Ehk;
    pnVar1->norm_Ehk = fVar4;
    pnVar1->nk = uVar3;
    this->_end = this->_end + 1;
    index = sVar6;
  }
  return index;
}

Assistant:

size_t unique_add_sorted(const T& new_ele)
  {
    size_t index = 0;
    size_t size = _end - _begin;
    size_t to_move;

    if (!contain_sorted(new_ele, index))
    {
      if (_end == end_array)
        resize(2 * (end_array - _begin) + 3);

      to_move = size - index;

      if (to_move > 0)
        memmove(_begin + index + 1, _begin + index,
            to_move * sizeof(T));  // kopiuje to_move*.. bytow z _begin+index do _begin+index+1

      _begin[index] = new_ele;

      _end++;
    }

    return index;
  }